

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_sbit_decoder_load_compound
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  FT_Byte *pFVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  TT_SBit_Metrics pTVar6;
  FT_UShort FVar7;
  FT_UShort FVar8;
  FT_Error FVar9;
  ushort uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  
  pFVar1 = p + 2;
  FVar9 = 3;
  if ((pFVar1 <= limit) &&
     (uVar10 = *(ushort *)p << 8 | *(ushort *)p >> 8, pFVar1 + (ulong)uVar10 * 4 <= limit)) {
    pTVar6 = decoder->metrics;
    uVar5._0_2_ = pTVar6->horiBearingX;
    uVar5._2_2_ = pTVar6->horiBearingY;
    FVar7 = pTVar6->horiAdvance;
    uVar2._0_2_ = pTVar6->vertBearingX;
    uVar2._2_2_ = pTVar6->vertBearingY;
    FVar8 = pTVar6->vertAdvance;
    for (lVar11 = 0; (uint)uVar10 != (uint)lVar11; lVar11 = lVar11 + 1) {
      FVar9 = tt_sbit_decoder_load_image
                        (decoder,(uint)(ushort)(*(ushort *)(pFVar1 + lVar11 * 4) << 8 |
                                               *(ushort *)(pFVar1 + lVar11 * 4) >> 8),
                         (char)p[lVar11 * 4 + 4] + x_pos,(char)p[lVar11 * 4 + 5] + y_pos,
                         recurse_count + 1,'\0');
      if (FVar9 != 0) goto LAB_0020b62b;
    }
    FVar9 = 0;
LAB_0020b62b:
    pTVar6 = decoder->metrics;
    auVar12 = psllw(ZEXT416(uVar5),8);
    auVar12 = psraw(auVar12,8);
    pTVar6->horiBearingX = (short)auVar12._0_4_;
    pTVar6->horiBearingY = (short)((uint)auVar12._0_4_ >> 0x10);
    pTVar6->horiAdvance = (ushort)(byte)FVar7;
    auVar12 = psllw(ZEXT416(uVar2),8);
    auVar12 = psraw(auVar12,8);
    pTVar6->vertBearingX = (short)auVar12._0_4_;
    pTVar6->vertBearingY = (short)((uint)auVar12._0_4_ >> 0x10);
    pTVar6->vertAdvance = (ushort)(byte)FVar8;
    uVar3 = decoder->bitmap->rows;
    uVar4 = decoder->bitmap->width;
    auVar12._4_4_ = uVar4;
    auVar12._0_4_ = uVar3;
    auVar12._8_8_ = 0;
    auVar12 = pshuflw(auVar12,auVar12,0xe8);
    uVar5 = auVar12._0_4_ & (uint)DAT_002bdf20;
    pTVar6->height = (short)uVar5;
    pTVar6->width = (short)(uVar5 >> 0x10);
  }
  return FVar9;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_compound( TT_SBitDecoder  decoder,
                                 FT_Byte*        p,
                                 FT_Byte*        limit,
                                 FT_Int          x_pos,
                                 FT_Int          y_pos,
                                 FT_UInt         recurse_count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   num_components, nn;

    FT_Char  horiBearingX = (FT_Char)decoder->metrics->horiBearingX;
    FT_Char  horiBearingY = (FT_Char)decoder->metrics->horiBearingY;
    FT_Byte  horiAdvance  = (FT_Byte)decoder->metrics->horiAdvance;
    FT_Char  vertBearingX = (FT_Char)decoder->metrics->vertBearingX;
    FT_Char  vertBearingY = (FT_Char)decoder->metrics->vertBearingY;
    FT_Byte  vertAdvance  = (FT_Byte)decoder->metrics->vertAdvance;


    if ( p + 2 > limit )
      goto Fail;

    num_components = FT_NEXT_USHORT( p );
    if ( p + 4 * num_components > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_compound: broken table\n" ));
      goto Fail;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: loading %d component%s\n",
                num_components,
                num_components == 1 ? "" : "s" ));

    for ( nn = 0; nn < num_components; nn++ )
    {
      FT_UInt  gindex = FT_NEXT_USHORT( p );
      FT_Char  dx     = FT_NEXT_CHAR( p );
      FT_Char  dy     = FT_NEXT_CHAR( p );


      /* NB: a recursive call */
      error = tt_sbit_decoder_load_image( decoder,
                                          gindex,
                                          x_pos + dx,
                                          y_pos + dy,
                                          recurse_count + 1,
                                          /* request full bitmap image */
                                          FALSE );
      if ( error )
        break;
    }

    FT_TRACE3(( "tt_sbit_decoder_load_compound: done\n" ));

    decoder->metrics->horiBearingX = horiBearingX;
    decoder->metrics->horiBearingY = horiBearingY;
    decoder->metrics->horiAdvance  = horiAdvance;
    decoder->metrics->vertBearingX = vertBearingX;
    decoder->metrics->vertBearingY = vertBearingY;
    decoder->metrics->vertAdvance  = vertAdvance;
    decoder->metrics->width        = (FT_Byte)decoder->bitmap->width;
    decoder->metrics->height       = (FT_Byte)decoder->bitmap->rows;

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }